

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

llama_context_params *
common_context_params_to_llama(llama_context_params *__return_storage_ptr__,common_params *params)

{
  int iVar1;
  void *pvVar2;
  int32_t iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  llama_pooling_type lVar7;
  ggml_type gVar8;
  int iVar9;
  
  llama_context_default_params();
  __return_storage_ptr__->n_seq_max = params->n_parallel;
  iVar3 = params->n_batch;
  __return_storage_ptr__->n_ctx = params->n_ctx;
  __return_storage_ptr__->n_batch = iVar3;
  __return_storage_ptr__->n_ubatch = params->n_ubatch;
  iVar1 = (params->cpuparams).n_threads;
  __return_storage_ptr__->n_threads = iVar1;
  iVar9 = (params->cpuparams_batch).n_threads;
  if (iVar9 == -1) {
    iVar9 = iVar1;
  }
  __return_storage_ptr__->n_threads_batch = iVar9;
  __return_storage_ptr__->logits_all = params->logits_all;
  __return_storage_ptr__->embeddings = params->embedding;
  fVar4 = params->rope_freq_scale;
  fVar5 = params->yarn_ext_factor;
  fVar6 = params->yarn_attn_factor;
  __return_storage_ptr__->rope_freq_base = params->rope_freq_base;
  __return_storage_ptr__->rope_freq_scale = fVar4;
  __return_storage_ptr__->yarn_ext_factor = fVar5;
  __return_storage_ptr__->yarn_attn_factor = fVar6;
  fVar4 = params->yarn_beta_slow;
  __return_storage_ptr__->yarn_beta_fast = params->yarn_beta_fast;
  __return_storage_ptr__->yarn_beta_slow = fVar4;
  __return_storage_ptr__->yarn_orig_ctx = params->yarn_orig_ctx;
  lVar7 = params->pooling_type;
  __return_storage_ptr__->rope_scaling_type = params->rope_scaling_type;
  __return_storage_ptr__->pooling_type = lVar7;
  __return_storage_ptr__->attention_type = params->attention_type;
  __return_storage_ptr__->defrag_thold = params->defrag_thold;
  pvVar2 = params->cb_eval_user_data;
  __return_storage_ptr__->cb_eval = params->cb_eval;
  __return_storage_ptr__->cb_eval_user_data = pvVar2;
  __return_storage_ptr__->offload_kqv = (bool)(params->no_kv_offload ^ 1);
  __return_storage_ptr__->flash_attn = params->flash_attn;
  __return_storage_ptr__->no_perf = params->no_perf;
  if (params->reranking == true) {
    __return_storage_ptr__->embeddings = true;
    __return_storage_ptr__->pooling_type = LLAMA_POOLING_TYPE_RANK;
  }
  gVar8 = params->cache_type_v;
  __return_storage_ptr__->type_k = params->cache_type_k;
  __return_storage_ptr__->type_v = gVar8;
  return __return_storage_ptr__;
}

Assistant:

struct llama_context_params common_context_params_to_llama(const common_params & params) {
    auto cparams = llama_context_default_params();

    cparams.n_ctx             = params.n_ctx;
    cparams.n_seq_max         = params.n_parallel;
    cparams.n_batch           = params.n_batch;
    cparams.n_ubatch          = params.n_ubatch;
    cparams.n_threads         = params.cpuparams.n_threads;
    cparams.n_threads_batch   = params.cpuparams_batch.n_threads == -1 ?
                                params.cpuparams.n_threads : params.cpuparams_batch.n_threads;
    cparams.logits_all        = params.logits_all;
    cparams.embeddings        = params.embedding;
    cparams.rope_scaling_type = params.rope_scaling_type;
    cparams.rope_freq_base    = params.rope_freq_base;
    cparams.rope_freq_scale   = params.rope_freq_scale;
    cparams.yarn_ext_factor   = params.yarn_ext_factor;
    cparams.yarn_attn_factor  = params.yarn_attn_factor;
    cparams.yarn_beta_fast    = params.yarn_beta_fast;
    cparams.yarn_beta_slow    = params.yarn_beta_slow;
    cparams.yarn_orig_ctx     = params.yarn_orig_ctx;
    cparams.pooling_type      = params.pooling_type;
    cparams.attention_type    = params.attention_type;
    cparams.defrag_thold      = params.defrag_thold;
    cparams.cb_eval           = params.cb_eval;
    cparams.cb_eval_user_data = params.cb_eval_user_data;
    cparams.offload_kqv       = !params.no_kv_offload;
    cparams.flash_attn        = params.flash_attn;
    cparams.no_perf           = params.no_perf;

    if (params.reranking) {
        cparams.embeddings    = true;
        cparams.pooling_type  = LLAMA_POOLING_TYPE_RANK;
    }

    cparams.type_k = params.cache_type_k;
    cparams.type_v = params.cache_type_v;

    return cparams;
}